

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O1

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_max>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  ulong uVar4;
  undefined1 (*pauVar5) [64];
  uint uVar6;
  undefined1 (*pauVar7) [64];
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  
  uVar1 = b->c;
  uVar6 = b->h * b->w * b->d * b->elempack;
  Mat::create_like(c,b,opt->blob_allocator);
  iVar8 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        pauVar5 = (undefined1 (*) [64])(b->cstep * uVar4 * b->elemsize + (long)b->data);
        pauVar7 = (undefined1 (*) [64])(c->cstep * uVar4 * c->elemsize + (long)c->data);
        auVar12 = vbroadcastss_avx512f(ZEXT416(*a->data));
        if ((int)uVar6 < 0x10) {
          uVar10 = 0;
        }
        else {
          iVar8 = 0xf;
          do {
            auVar13 = vmaxps_avx512f(auVar12,*pauVar5);
            *pauVar7 = auVar13;
            pauVar5 = pauVar5 + 1;
            pauVar7 = pauVar7 + 1;
            iVar8 = iVar8 + 0x10;
            uVar10 = uVar6 & 0xfffffff0;
          } while (iVar8 < (int)uVar6);
        }
        uVar14 = auVar12._0_4_;
        if ((int)(uVar10 | 7) < (int)uVar6) {
          auVar16._4_4_ = uVar14;
          auVar16._0_4_ = uVar14;
          auVar16._8_4_ = uVar14;
          auVar16._12_4_ = uVar14;
          auVar16._16_4_ = uVar14;
          auVar16._20_4_ = uVar14;
          auVar16._24_4_ = uVar14;
          auVar16._28_4_ = uVar14;
          uVar9 = uVar10;
          do {
            auVar3 = vmaxps_avx(auVar16,*(undefined1 (*) [32])*pauVar5);
            *(undefined1 (*) [32])*pauVar7 = auVar3;
            pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x20);
            pauVar7 = (undefined1 (*) [64])((long)*pauVar7 + 0x20);
            uVar10 = uVar9 + 8;
            iVar8 = uVar9 + 0xf;
            uVar9 = uVar10;
          } while (iVar8 < (int)uVar6);
        }
        if ((int)(uVar10 | 3) < (int)uVar6) {
          auVar15._4_4_ = uVar14;
          auVar15._0_4_ = uVar14;
          auVar15._8_4_ = uVar14;
          auVar15._12_4_ = uVar14;
          uVar9 = uVar10;
          do {
            auVar2 = vmaxps_avx(auVar15,*(undefined1 (*) [16])*pauVar5);
            *(undefined1 (*) [16])*pauVar7 = auVar2;
            pauVar5 = (undefined1 (*) [64])(*pauVar5 + 0x10);
            pauVar7 = (undefined1 (*) [64])((long)*pauVar7 + 0x10);
            uVar10 = uVar9 + 4;
            iVar8 = uVar9 + 7;
            uVar9 = uVar10;
          } while (iVar8 < (int)uVar6);
        }
        if (uVar6 - uVar10 != 0 && (int)uVar10 <= (int)uVar6) {
          lVar11 = 0;
          do {
            auVar15 = vmaxss_avx(auVar12._0_16_,ZEXT416(*(uint *)(*pauVar5 + lVar11 * 4)));
            *(int *)((long)*pauVar7 + lVar11 * 4) = auVar15._0_4_;
            lVar11 = lVar11 + 1;
          } while (uVar6 - uVar10 != (int)lVar11);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar1);
    }
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}